

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::egl::anon_unknown_0::ClientWaitForeverTest::iterate(ClientWaitForeverTest *this)

{
  ostringstream *poVar1;
  EGLSyncKHR *value;
  EGLDisplay *value_00;
  ostringstream *poVar2;
  EGLenum EVar3;
  TestLog *pTVar4;
  int iVar5;
  deUint32 dVar6;
  GLenum err;
  Library *pLVar7;
  undefined4 extraout_var;
  MessageBuilder *pMVar8;
  TestError *this_00;
  char *pcVar9;
  char *pcVar10;
  undefined1 local_1b0 [384];
  
  pLVar7 = EglTestContext::getLibrary((this->super_SyncTest).super_TestCase.m_eglTestCtx);
  pTVar4 = ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar5 = (*pLVar7->_vptr_Library[0x11])
                    (pLVar7,(this->super_SyncTest).m_eglDisplay,
                     (ulong)(this->super_SyncTest).m_syncType,0);
  value = &(this->super_SyncTest).m_sync;
  (this->super_SyncTest).m_sync = (EGLSyncKHR)CONCAT44(extraout_var,iVar5);
  local_1b0._0_8_ = pTVar4;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
  pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
  std::operator<<(&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  " = eglCreateSyncKHR(");
  value_00 = &(this->super_SyncTest).m_eglDisplay;
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,value_00);
  poVar1 = &pMVar8->m_str;
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
  EVar3 = (this->super_SyncTest).m_syncType;
  pcVar9 = "<Unknown>";
  if (EVar3 == 0x30fa) {
    pcVar9 = "EGL_SYNC_REUSABLE_KHR";
  }
  pcVar10 = "EGL_SYNC_FENCE_KHR";
  if (EVar3 != 0x30f9) {
    pcVar10 = pcVar9;
  }
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,pcVar10);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", NULL)");
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  dVar6 = (*pLVar7->_vptr_Library[0x1f])(pLVar7);
  eglu::checkError(dVar6,"eglCreateSyncKHR()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                   ,0x1f6);
  EVar3 = (this->super_SyncTest).m_syncType;
  if (EVar3 == 0x30f9) {
    (*(this->super_SyncTest).m_gl.flush)();
    err = (*(this->super_SyncTest).m_gl.getError)();
    glu::checkError(err,"flush()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                    ,0x200);
    poVar2 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar4;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"glFlush()");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
  }
  else if (EVar3 == 0x30fa) {
    (*pLVar7->_vptr_Library[0x2f])(pLVar7,*value_00,*value,0x30f2);
    poVar2 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar4;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<((ostream *)poVar2," = eglSignalSyncKHR(");
    pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value_00);
    std::operator<<(&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,value);
    std::operator<<(&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    ", EGL_SIGNALED_KHR)");
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    dVar6 = (*pLVar7->_vptr_Library[0x1f])(pLVar7);
    eglu::checkError(dVar6,"eglSignalSyncKHR()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                     ,0x1fc);
  }
  iVar5 = (*pLVar7->_vptr_Library[4])(pLVar7,*value_00,*value,0,0xffffffffffffffff);
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar4;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::ostream::operator<<(poVar2,iVar5);
  std::operator<<((ostream *)poVar2," = eglClientWaitSyncKHR(");
  pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value_00);
  std::operator<<(&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,value);
  std::operator<<(&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  ", 0, EGL_FOREVER_KHR)");
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  if (iVar5 == 0x30f6) {
    dVar6 = (*pLVar7->_vptr_Library[0x1f])(pLVar7);
    eglu::checkError(dVar6,"eglClientWaitSyncKHR()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                     ,0x20a);
    tcu::TestContext::setTestResult
              ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
    return STOP;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"status == EGL_CONDITION_SATISFIED_KHR",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
             ,0x209);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult	iterate					(void)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		TestLog&		log		= m_testCtx.getLog();

		m_sync = egl.createSyncKHR(m_eglDisplay, m_syncType, NULL);
		log << TestLog::Message << m_sync << " = eglCreateSyncKHR(" << m_eglDisplay << ", " << getSyncTypeName(m_syncType) << ", NULL)" << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "eglCreateSyncKHR()");

		if (m_syncType == EGL_SYNC_REUSABLE_KHR)
		{
			EGLBoolean ret = egl.signalSyncKHR(m_eglDisplay, m_sync, EGL_SIGNALED_KHR);
			log << TestLog::Message << ret << " = eglSignalSyncKHR(" << m_eglDisplay << ", " << m_sync << ", EGL_SIGNALED_KHR)" << TestLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglSignalSyncKHR()");
		}
		else if (m_syncType == EGL_SYNC_FENCE_KHR)
		{
			GLU_CHECK_GLW_CALL(m_gl, flush());
			log << TestLog::Message << "glFlush()" << TestLog::EndMessage;
		}
		else
			DE_ASSERT(DE_FALSE);

		EGLint status = egl.clientWaitSyncKHR(m_eglDisplay, m_sync, 0, EGL_FOREVER_KHR);
		log << TestLog::Message << status << " = eglClientWaitSyncKHR(" << m_eglDisplay << ", " << m_sync << ", 0, EGL_FOREVER_KHR)" << TestLog::EndMessage;

		TCU_CHECK(status == EGL_CONDITION_SATISFIED_KHR);
		EGLU_CHECK_MSG(egl, "eglClientWaitSyncKHR()");

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}